

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressIndex
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *objectAddress)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  undefined4 *puVar6;
  
  pcVar1 = (this->super_HeapBlock).address;
  if (objectAddress < pcVar1 || pcVar1 + 0x1000 <= objectAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x227,"(objectAddress >= address && objectAddress < this->GetEndAddress())",
                       "objectAddress >= address && objectAddress < this->GetEndAddress()");
    if (!bVar3) goto LAB_006a53a6;
    *puVar6 = 0;
  }
  if (((ulong)objectAddress & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x228,"(HeapInfo::IsAlignedAddress(objectAddress))",
                       "HeapInfo::IsAlignedAddress(objectAddress)");
    if (!bVar3) goto LAB_006a53a6;
    *puVar6 = 0;
  }
  pcVar1 = (this->super_HeapBlock).address;
  iVar5 = (int)pcVar1;
  if (((ulong)pcVar1 & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x229,"(HeapInfo::IsAlignedAddress(address))",
                       "HeapInfo::IsAlignedAddress(address)");
    if (!bVar3) goto LAB_006a53a6;
    *puVar6 = 0;
    iVar5 = (int)(this->super_HeapBlock).address;
  }
  uVar4 = ValidPointers<SmallAllocationBlockAttributes>::GetAddressIndex
                    (&this->validPointers,(uint)((int)objectAddress - iVar5) >> 4);
  if (0x100 < (ushort)(uVar4 + 1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x230,
                       "(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit)"
                       ,
                       "index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit || index <= TBlockAttributes::MaxAddressBit"
                      );
    if (!bVar3) {
LAB_006a53a6:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return uVar4;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::GetAddressIndex(void * objectAddress)
{
    Assert(objectAddress >= address && objectAddress < this->GetEndAddress());
    Assert(HeapInfo::IsAlignedAddress(objectAddress));
    Assert(HeapInfo::IsAlignedAddress(address));

    unsigned int offset = (unsigned int)((char*)objectAddress - address);
    offset = offset >> HeapConstants::ObjectAllocationShift;

    ushort index = validPointers.GetAddressIndex(offset);
    Assert(index == SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit ||
        index <= TBlockAttributes::MaxAddressBit);
    return index;
}